

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseMethodOptions
          (Parser *this,LocationRecorder *parent_location,FileDescriptorProto *containing_file,
          int optionsFieldNumber,Message *mutable_options)

{
  bool bVar1;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  LocationRecorder location;
  LocationRecorder local_48;
  
  text._M_str = "{";
  text._M_len = 1;
  ConsumeEndOfDeclaration(this,text,parent_location);
  text_00._M_str = "}";
  text_00._M_len = 1;
  bVar1 = TryConsumeEndOfDeclaration(this,text_00,(LocationRecorder *)0x0);
  if (!bVar1) {
    if ((this->input_->current_).type != TYPE_END) {
      do {
        text_01._M_str = ";";
        text_01._M_len = 1;
        bVar1 = TryConsumeEndOfDeclaration(this,text_01,(LocationRecorder *)0x0);
        if (!bVar1) {
          LocationRecorder::Init(&local_48,parent_location,parent_location->source_code_info_);
          RepeatedField<int>::Add(&((local_48.location_)->field_0)._impl_.path_,optionsFieldNumber);
          bVar1 = ParseOption(this,mutable_options,&local_48,containing_file,OPTION_STATEMENT);
          if (!bVar1) {
            SkipStatement(this);
          }
          LocationRecorder::~LocationRecorder(&local_48);
        }
        text_02._M_str = "}";
        text_02._M_len = 1;
        bVar1 = TryConsumeEndOfDeclaration(this,text_02,(LocationRecorder *)0x0);
        if (bVar1) {
          return bVar1;
        }
      } while ((this->input_->current_).type != TYPE_END);
    }
    RecordError(this,(ErrorMaker)ZEXT816(0x65d4e0));
  }
  return bVar1;
}

Assistant:

bool Parser::ParseMethodOptions(const LocationRecorder& parent_location,
                                const FileDescriptorProto* containing_file,
                                const int optionsFieldNumber,
                                Message* mutable_options) {
  // Options!
  ConsumeEndOfDeclaration("{", &parent_location);
  while (!TryConsumeEndOfDeclaration("}", nullptr)) {
    if (AtEnd()) {
      RecordError("Reached end of input in method options (missing '}').");
      return false;
    }

    if (TryConsumeEndOfDeclaration(";", nullptr)) {
      // empty statement; ignore
    } else {
      LocationRecorder location(parent_location, optionsFieldNumber);
      if (!ParseOption(mutable_options, location, containing_file,
                       OPTION_STATEMENT)) {
        // This statement failed to parse.  Skip it, but keep looping to
        // parse other statements.
        SkipStatement();
      }
    }
  }

  return true;
}